

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::EndianityString(uint Endian)

{
  undefined1 auStack_18 [4];
  uint Endian_local;
  
  if (Endian == 0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_END_default");
  }
  else if (Endian == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_END_big");
  }
  else if (Endian == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_END_little");
  }
  else if (Endian == 0x40) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_END_lo_user");
  }
  else if (Endian == 0xff) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_END_hi_user");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::EndianityString(unsigned Endian) {
  switch (Endian) {
  case DW_END_default:
    return "DW_END_default";
  case DW_END_big:
    return "DW_END_big";
  case DW_END_little:
    return "DW_END_little";
  case DW_END_lo_user:
    return "DW_END_lo_user";
  case DW_END_hi_user:
    return "DW_END_hi_user";
  }
  return StringRef();
}